

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

double __thiscall
HEkk::computeDualForTableauColumn(HEkk *this,HighsInt iVar,HVector *tableau_column)

{
  double dVar1;
  int iVar2;
  reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  HighsInt iRow;
  HighsInt i;
  double dual;
  vector<int,_std::allocator<int>_> *basicIndex;
  vector<double,_std::allocator<double>_> *workCost;
  undefined4 local_34;
  undefined8 local_30;
  
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),(long)in_ESI);
  local_30 = *pvVar3;
  for (local_34 = 0; local_34 < *(int *)(in_RDX + 4); local_34 = local_34 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDX + 8),(long)local_34);
    iVar2 = *pvVar4;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),(long)iVar2);
    dVar1 = *pvVar5;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x2978),(long)iVar2);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),(long)*pvVar4);
    local_30 = -dVar1 * *pvVar5 + local_30;
  }
  return local_30;
}

Assistant:

double HEkk::computeDualForTableauColumn(const HighsInt iVar,
                                         const HVector& tableau_column) {
  const vector<double>& workCost = info_.workCost_;
  const vector<HighsInt>& basicIndex = basis_.basicIndex_;

  double dual = info_.workCost_[iVar];
  for (HighsInt i = 0; i < tableau_column.count; i++) {
    HighsInt iRow = tableau_column.index[i];
    dual -= tableau_column.array[iRow] * workCost[basicIndex[iRow]];
  }
  return dual;
}